

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O3

void __thiscall QTuioHandler::process2DCurAlive(QTuioHandler *this,QOscMessage *message)

{
  QTuioHandler *this_00;
  undefined8 uVar1;
  int *piVar2;
  QDebug this_01;
  bool bVar3;
  int iVar4;
  QMap<int,_QTuioCursor> QVar5;
  totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
  tVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  undefined8 *puVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  int cursorId;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QMap<int,_QTuioCursor> local_a0;
  QMap<int,_QTuioCursor> local_98;
  QArrayDataPointer<QVariant> local_90;
  undefined1 local_78 [20];
  undefined4 uStack_64;
  undefined1 uStack_60;
  QTuioCursor local_58;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.d = (message->m_arguments).d.d;
  local_90.ptr = (message->m_arguments).d.ptr;
  local_90.size = (message->m_arguments).d.size;
  if (local_90.d != (Data *)0x0) {
    LOCK();
    ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d.d.ptr =
       *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
         *)(this + 0x28);
  if (local_98.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_98.d.d.ptr = *(int *)local_98.d.d.ptr + 1;
    UNLOCK();
  }
  local_a0.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
          )0x0;
  if (1 < (ulong)local_90.size) {
    uVar10 = 1;
    do {
      iVar4 = QVariant::typeId(local_90.ptr + uVar10);
      if (iVar4 != 2) {
        lcTuioHandler();
        if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          local_58.m_id = 2;
          local_58.m_x = 0.0;
          local_58.m_y = 0.0;
          local_58.m_vx = 0.0;
          local_58.m_vy = 0.0;
          local_58.m_acceleration = 0.0;
          local_58._24_4_ = SUB84(lcTuioHandler::category.name,0);
          uStack_3c = (undefined4)((ulong)lcTuioHandler::category.name >> 0x20);
          QMessageLogger::warning();
          this_01.stream = local_b8.stream;
          QVar11.m_data = (storage_type *)0x3f;
          QVar11.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar11);
          QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)local_78);
          piVar2 = (int *)CONCAT44(local_78._4_4_,local_78._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_),2,0x10);
            }
          }
          if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
          }
          QTextStream::operator<<((QTextStream *)local_b8.stream,(int)uVar10);
          if (*(QTextStream *)(local_b8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_b8.stream,' ');
          }
          *(int *)((QTextStream *)local_b8.stream + 0x28) =
               *(int *)((QTextStream *)local_b8.stream + 0x28) + 1;
          local_b0.stream = (Stream *)0x0;
          local_78._0_4_ = SUB84(local_b8.stream,0);
          local_78._4_4_ = (undefined4)((ulong)local_b8.stream >> 0x20);
          QtPrivate::printSequentialContainer<QList<QVariant>>
                    ((QtPrivate *)&local_a8,(Stream *)local_78,"QList",(QList<QVariant> *)&local_90)
          ;
          QDebug::~QDebug((QDebug *)local_78);
          QTextStream::operator<<
                    ((QTextStream *)CONCAT44(local_a8.stream._4_4_,(int)local_a8.stream),')');
          if (((QTextStream *)CONCAT44(local_a8.stream._4_4_,(int)local_a8.stream))[0x30] ==
              (QTextStream)0x1) {
            QTextStream::operator<<
                      ((QTextStream *)CONCAT44(local_a8.stream._4_4_,(int)local_a8.stream),' ');
          }
          QDebug::~QDebug(&local_a8);
          QDebug::~QDebug(&local_b0);
          QDebug::~QDebug(&local_b8);
        }
        goto LAB_00109eb8;
      }
      local_a8.stream._0_4_ = QVariant::toInt((bool *)(local_90.ptr + uVar10));
      bVar3 = QMap<int,_QTuioCursor>::contains(&local_98,(int *)&local_a8);
      if (bVar3) {
        local_58.m_id = -0x55555556;
        local_58.m_acceleration = -NAN;
        local_58.m_x = -NAN;
        local_58.m_y = -NAN;
        local_58.m_vx = -NAN;
        local_58.m_vy = -NAN;
        local_58.m_state = 0xaa;
        local_58._25_3_ = 0xaaaaaa;
        local_78._0_4_ = 0xffffffff;
        local_78._4_4_ = 0;
        local_78._8_12_ = SUB1612((undefined1  [16])0x0,4);
        uStack_64 = 0;
        uStack_60 = 1;
        puVar9 = (undefined8 *)local_78;
        if ((local_98.d.d.ptr !=
             (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
              )0x0) &&
           (p_Var7 = *(_Base_ptr *)((long)local_98.d.d.ptr + 0x18), p_Var7 != (_Base_ptr)0x0)) {
          p_Var8 = (_Base_ptr)((long)local_98.d.d.ptr + 0x10);
          do {
            if ((int)local_a8.stream <= (int)p_Var7[1]._M_color) {
              p_Var8 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < (int)local_a8.stream];
          } while (p_Var7 != (_Base_ptr)0x0);
          if ((p_Var8 != (_Base_ptr)((long)local_98.d.d.ptr + 0x10)) &&
             (puVar9 = (undefined8 *)&p_Var8[1].field_0x4,
             (int)local_a8.stream < (int)p_Var8[1]._M_color)) {
            puVar9 = (undefined8 *)local_78;
          }
        }
        local_58.m_vy = (float)((ulong)*(undefined8 *)((long)puVar9 + 0xc) >> 0x20);
        local_58.m_acceleration = (float)*(undefined8 *)((long)puVar9 + 0x14);
        local_58.m_id = (int)*puVar9;
        local_58.m_x = (float)((ulong)*puVar9 >> 0x20);
        local_58.m_y = (float)puVar9[1];
        local_58.m_vx = (float)((ulong)puVar9[1] >> 0x20);
        local_58._25_3_ = SUB83((ulong)*(undefined8 *)((long)puVar9 + 0x14) >> 0x28,0);
        local_58.m_state = Stationary;
        QMap<int,_QTuioCursor>::insert(&local_a0,(int *)&local_a8,&local_58);
        QMap<int,_QTuioCursor>::remove(&local_98,(char *)&local_a8);
      }
      else {
        local_58.m_id = (int)local_a8.stream;
        local_58.m_x = 0.0;
        local_58.m_y = 0.0;
        local_58.m_vx = 0.0;
        local_58.m_vy = 0.0;
        local_58.m_acceleration = 0.0;
        local_58.m_state = Pressed;
        local_58._25_3_ = 0xaaaaaa;
        QMap<int,_QTuioCursor>::insert(&local_a0,(int *)&local_a8,&local_58);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)local_90.size);
  }
  if (local_98.d.d.ptr ==
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    tVar6.ptr = (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                 *)0x0;
    p_Var7 = (_Base_ptr)0x0;
  }
  else {
    tVar6.ptr = *(QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                  **)((long)local_98.d.d.ptr + 0x20);
    p_Var7 = *(_Base_ptr *)((long)local_98.d.d.ptr + 0x30);
  }
  this_00 = this + 0x30;
  QList<QTuioCursor>::reserve((QList<QTuioCursor> *)this_00,(qsizetype)p_Var7);
  while( true ) {
    QVar5.d.d.ptr = local_98.d.d.ptr;
    if (local_98.d.d.ptr !=
        (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
         )0x0) {
      QVar5.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
            )(totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
              )((long)local_98.d.d.ptr + 0x10);
    }
    if ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
         )tVar6.ptr == QVar5.d.d.ptr) break;
    QtPrivate::QMovableArrayOps<QTuioCursor>::emplace<QTuioCursor_const&>
              ((QMovableArrayOps<QTuioCursor> *)this_00,*(qsizetype *)(this + 0x40),
               (QTuioCursor *)
               ((long)&((tVar6.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4));
    QList<QTuioCursor>::end((QList<QTuioCursor> *)this_00);
    tVar6.ptr = (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                 *)std::_Rb_tree_increment(tVar6.ptr);
  }
  if (local_a0.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_a0.d.d.ptr = *(int *)local_a0.d.d.ptr + 1;
    UNLOCK();
  }
  uVar1 = *(undefined8 *)(this + 0x28);
  *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
    *)(this + 0x28) = local_a0.d.d.ptr;
  local_58.m_id = (int)uVar1;
  local_58.m_x = (float)((ulong)uVar1 >> 0x20);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
              *)&local_58);
LAB_00109eb8:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_a0.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_98.d);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DCurAlive(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();

    // delta the notified cursors that are active, against the ones we already
    // know of.
    //
    // TBD: right now we're assuming one 2Dcur alive message corresponds to a
    // new data source from the input. is this correct, or do we need to store
    // changes and only process the deltas on fseq?
    QMap<int, QTuioCursor> oldActiveCursors = m_activeCursors;
    QMap<int, QTuioCursor> newActiveCursors;

    for (int i = 1; i < arguments.size(); ++i) {
        if (QMetaType::Type(arguments.at(i).userType()) != QMetaType::Int) {
            qCWarning(lcTuioHandler) << "Ignoring malformed TUIO alive message (bad argument on position" << i << arguments << ')';
            return;
        }

        int cursorId = arguments.at(i).toInt();
        if (!oldActiveCursors.contains(cursorId)) {
            // newly active
            QTuioCursor cursor(cursorId);
            cursor.setState(QEventPoint::State::Pressed);
            newActiveCursors.insert(cursorId, cursor);
        } else {
            // we already know about it, remove it so it isn't marked as released
            QTuioCursor cursor = oldActiveCursors.value(cursorId);
            cursor.setState(QEventPoint::State::Stationary); // position change in SET will update if needed
            newActiveCursors.insert(cursorId, cursor);
            oldActiveCursors.remove(cursorId);
        }
    }

    // anything left is dead now
    QMap<int, QTuioCursor>::ConstIterator it = oldActiveCursors.constBegin();

    // deadCursors should be cleared from the last FSEQ now
    m_deadCursors.reserve(oldActiveCursors.size());

    // TODO: there could be an issue of resource exhaustion here if FSEQ isn't
    // sent in a timely fashion. we should probably track message counts and
    // force-flush if we get too many built up.
    while (it != oldActiveCursors.constEnd()) {
        m_deadCursors.append(it.value());
        ++it;
    }

    m_activeCursors = newActiveCursors;
}